

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatIndexBuilder.cpp
# Opt level: O2

void __thiscall FlatIndexBuilder::add_trigram(FlatIndexBuilder *this,FileId fid,TriGram val)

{
  ulong local_8;
  
  local_8 = (ulong)val << 0x28 | (ulong)fid;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->raw_data,&local_8);
  return;
}

Assistant:

void FlatIndexBuilder::add_trigram(FileId fid, TriGram val) {
    raw_data.push_back(fid | (uint64_t{val} << 40ULL));
}